

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

ConstantInt * __thiscall LLVMBC::SwitchInst::Case::getCaseValue(Case *this)

{
  ConstantInt *pCVar1;
  Case *this_local;
  
  pCVar1 = cast<LLVMBC::ConstantInt>(this->value);
  return pCVar1;
}

Assistant:

ConstantInt *SwitchInst::Case::getCaseValue() const
{
	return cast<ConstantInt>(value);
}